

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::MergingIterator::FindLargest(MergingIterator *this)

{
  IteratorWrapper *pIVar1;
  undefined8 *puVar2;
  IteratorWrapper *pIVar3;
  int iVar4;
  IteratorWrapper *pIVar5;
  IteratorWrapper *pIVar6;
  long lVar7;
  long lVar8;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined8 local_40;
  undefined8 uStack_38;
  
  lVar7 = (long)this->n_;
  if (lVar7 < 1) {
    pIVar6 = (IteratorWrapper *)0x0;
  }
  else {
    lVar8 = lVar7 + 1;
    pIVar5 = (IteratorWrapper *)0x0;
    lVar7 = lVar7 << 5;
    do {
      pIVar3 = this->children_;
      pIVar6 = pIVar5;
      if (((&pIVar3[-1].valid_)[lVar7] == true) &&
         (pIVar1 = (IteratorWrapper *)((long)&pIVar3[-1].iter_ + lVar7), pIVar6 = pIVar1,
         pIVar5 != (IteratorWrapper *)0x0)) {
        if ((&pIVar3[-1].valid_)[lVar7] == false) {
LAB_00138368:
          __assert_fail("Valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/iterator_wrapper.h"
                        ,0x27,"Slice leveldb::IteratorWrapper::key() const");
        }
        puVar2 = (undefined8 *)((long)&pIVar3[-1].key_.data_ + lVar7);
        local_40 = *puVar2;
        uStack_38 = puVar2[1];
        if (pIVar5->valid_ == false) goto LAB_00138368;
        local_50 = *(undefined4 *)&(pIVar5->key_).data_;
        uStack_4c = *(undefined4 *)((long)&(pIVar5->key_).data_ + 4);
        uStack_48 = (undefined4)(pIVar5->key_).size_;
        uStack_44 = *(undefined4 *)((long)&(pIVar5->key_).size_ + 4);
        iVar4 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_40,&local_50);
        pIVar6 = pIVar5;
        if (0 < iVar4) {
          pIVar6 = pIVar1;
        }
      }
      lVar8 = lVar8 + -1;
      pIVar5 = pIVar6;
      lVar7 = lVar7 + -0x20;
    } while (1 < lVar8);
  }
  this->current_ = pIVar6;
  return;
}

Assistant:

void MergingIterator::FindLargest() {
  IteratorWrapper* largest = nullptr;
  for (int i = n_ - 1; i >= 0; i--) {
    IteratorWrapper* child = &children_[i];
    if (child->Valid()) {
      if (largest == nullptr) {
        largest = child;
      } else if (comparator_->Compare(child->key(), largest->key()) > 0) {
        largest = child;
      }
    }
  }
  current_ = largest;
}